

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
* __thiscall
pstore::http::
read_frame<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
           *__return_storage_ptr__,http *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io)

{
  descriptor<pstore::details::posix_descriptor_traits> *io_00;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_60;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<frame_fixed_layout,__1L>::element_type>_>
  local_50;
  anon_class_8_1_69694a01 local_30;
  frame_fixed_layout local_22;
  http *phStack_20;
  frame_fixed_layout res;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *reader_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_22.raw = 0;
  local_30.reader =
       (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
        *)this;
  phStack_20 = this;
  reader_local = reader;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  io_00 = std::reference_wrapper::operator_cast_to_descriptor_((reference_wrapper *)&reader_local);
  local_60 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::make_span<pstore::http::frame_fixed_layout>(&local_22,1);
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::get_span<pstore::gsl::span<pstore::http::frame_fixed_layout,_1l>>
            (&local_50,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)this,io_00,(span<pstore::http::frame_fixed_layout,__1L> *)&local_60);
  pstore::operator>>=(__return_storage_ptr__,&local_50,&local_30);
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::span<pstore::http::frame_fixed_layout,_-1L>_>_>
  ::~error_or(&local_50);
  return __return_storage_ptr__;
}

Assistant:

error_or_n<IO, frame> read_frame (Reader & reader, IO io) {
            frame_fixed_layout res{};

            return reader.get_span (
                       io, gsl::make_span (
                               &res, 1)) >>= [&reader] (IO io1,
                                                        gsl::span<frame_fixed_layout> const & p1) {
                using return_type = error_or_n<IO, frame>;

                if (p1.size () != 1) {
                    return return_type{ws_error::insufficient_data};
                }

                frame_fixed_layout & part1 = p1.at (0);
                part1.raw = network_to_host (part1.raw);

                if (log_frame_info) {
                    log (logger::priority::info, "fin: ", part1.fin);
                    log (logger::priority::info, "rsv: ", part1.rsv);
                    log (logger::priority::info,
                         "opcode: ", opcode_name (static_cast<opcode> (part1.opcode.value ())));
                    log (logger::priority::info, "mask: ", part1.mask);
                    log (logger::priority::info, "payload_length: ", part1.payload_length);
                }

                // "The rsv[n] fields MUST be 0 unless an extension is negotiated that defines
                // meanings for non-zero values. If a nonzero value is received and none of the
                // negotiated extensions defines the meaning of such a nonzero value, the receiving
                // endpoint MUST _Fail the WebSocket Connection_."
                if (part1.rsv != 0) {
                    return return_type{ws_error::reserved_bit_set};
                }

                // "The server MUST close the connection upon receiving a frame that is not masked."
                if (!part1.mask) {
                    return return_type{ws_error::unmasked_frame};
                }

                return details::read_payload_length (reader, io1, part1.payload_length) >>=
                       [&] (IO io2, std::uint64_t const payload_length) {
                           log (logger::priority::info, "Payload length: ", payload_length);
                           if ((payload_length & (std::uint64_t{1} << 63U)) != 0U) {
                               // "The most significant bit MUST be 0."
                               return return_type{ws_error::payload_too_long};
                           }

                           constexpr auto mask_length = 4U;
                           std::array<std::uint8_t, mask_length> mask_arr{{0}};
                           return reader.get_span (io2, gsl::make_span (mask_arr)) >>=
                                  [&] (IO io3, gsl::span<std::uint8_t> const & mask) {
                                      if (mask.size () != mask_length) {
                                          return return_type{ws_error::insufficient_data};
                                      }

                                      std::vector<std::uint8_t> payload (
                                          std::vector<std::uint8_t>::size_type{payload_length},
                                          std::uint8_t{0});

                                      return reader.get_span (io3, gsl::make_span (payload)) >>=
                                             [&] (IO io4,
                                                  gsl::span<std::uint8_t> const & payload_span) {
                                                 return details::decode_payload (
                                                            payload_length, mask, payload_span) >>=
                                                        [&] (gsl::span<std::uint8_t> const &) {
                                                            return return_type{
                                                                in_place, io4,
                                                                frame{part1.opcode, part1.fin,
                                                                      std::move (payload)}};
                                                        };
                                             };
                                  };
                       };
            };
        }